

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O1

void __thiscall
PGSStreamReader::setVideoInfo(PGSStreamReader *this,uint16_t width,uint16_t height,double fps)

{
  undefined6 in_register_00000012;
  undefined6 in_register_00000032;
  
  this->m_scaled_width = width;
  this->m_scaled_height = height;
  this->m_newFps = fps;
  if ((int)CONCAT62(in_register_00000012,height) != 0 &&
      (int)CONCAT62(in_register_00000032,width) != 0) {
    text_subtitles::TextToPGSConverter::enlargeCrop
              (this->m_render,width,height,&this->m_scaled_width,&this->m_scaled_height);
  }
  text_subtitles::TextToPGSConverter::setVideoInfo
            (this->m_render,this->m_scaled_width,this->m_scaled_height,this->m_newFps);
  return;
}

Assistant:

void PGSStreamReader::setVideoInfo(const uint16_t width, const uint16_t height, const double fps)
{
    m_scaled_width = width;
    m_scaled_height = height;
    m_newFps = fps;
    if (width && height)
        m_render->enlargeCrop(width, height, &m_scaled_width, &m_scaled_height);
    m_render->setVideoInfo(m_scaled_width, m_scaled_height, m_newFps);
}